

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

int deqp::gles3::Functional::numBitsLostInOp(float input,float output)

{
  int iVar1;
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  int local_1c;
  Float<unsigned_int,_8,_23,_127,_3U> local_18;
  int outExp;
  float local_10;
  int inExp;
  float output_local;
  float input_local;
  
  local_10 = output;
  inExp = (int)input;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_18,input);
  outExp = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_18);
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_20,local_10);
  local_1c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_20);
  iVar1 = de::max<int>(0,outExp - local_1c);
  return iVar1;
}

Assistant:

inline int numBitsLostInOp (float input, float output)
{
	const int	inExp		= tcu::Float32(input).exponent();
	const int	outExp		= tcu::Float32(output).exponent();

	return de::max(0, inExp-outExp); // Lost due to mantissa shift.
}